

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2d583::matrix_dot_notmatch_1_Test::TestBody(matrix_dot_notmatch_1_Test *this)

{
  long lVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  matrix m3;
  matrix m2;
  matrix m1;
  allocator_type local_e3;
  allocator_type local_e2;
  allocator_type local_e1;
  axes_type local_e0;
  matrix local_d8;
  vector<double,_std::allocator<double>_> local_a8;
  undefined1 local_90 [48];
  double local_60 [2];
  matrix local_50;
  
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&DAT_4000000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_90,__l,&local_e2);
  local_60[0] = 3.0;
  local_60[1] = 4.0;
  __l_00._M_len = 2;
  __l_00._M_array = local_60;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_90 + 0x18),__l_00,&local_e3);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_90;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_d8,__l_01,&local_e1);
  local_e0._M_elems[0] = 2;
  local_e0._M_elems[1] = 2;
  dnet::data_types::matrix::matrix(&local_50,(type *)&local_d8,&local_e0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_d8);
  lVar1 = 0x18;
  do {
    if (*(void **)(local_90 + lVar1) != (void *)0x0) {
      operator_delete(*(void **)(local_90 + lVar1));
    }
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_60[0] = 1.0;
  local_60[1] = 2.0;
  __l_02._M_len = 2;
  __l_02._M_array = local_60;
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,__l_02,&local_e2);
  __l_03._M_len = 1;
  __l_03._M_array = &local_a8;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_d8,__l_03,(allocator_type *)&local_e3);
  local_e0._M_elems = (_Type)&DAT_200000001;
  dnet::data_types::matrix::matrix((matrix *)local_90,(type *)&local_d8,&local_e0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_d8);
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dnet::data_types::matrix::dot(&local_d8,&local_50,(matrix *)local_90);
  if (local_d8.super_tensor<double,_2U>._data.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super_tensor<double,_2U>._data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_90._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._0_8_);
  }
  if (local_50.super_tensor<double,_2U>._data.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super_tensor<double,_2U>._data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(matrix, dot_notmatch_1)
    {
        matrix m1({{1, 2}, {3, 4}}, {2, 2});
        matrix m2({{1, 2}}, {1, 2});
        try {
            matrix m3 = m1.dot(m2);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e;
        }
    }